

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

BOOL __thiscall Js::JavascriptRegExp::IsConfigurable(JavascriptRegExp *this,PropertyId propertyId)

{
  char cVar1;
  ScriptContext *pSVar2;
  BOOL BVar3;
  ThreadConfiguration *pTVar4;
  PropertyId PVar5;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  switch(propertyId) {
  case 0x1a1:
    goto switchD_00bb39ea_caseD_1a1;
  case 0x1a2:
    goto switchD_00bb39ea_caseD_1a2;
  case 0x1a4:
    pTVar4 = (pSVar2->config).threadConfig;
    PVar5 = 0x1a4;
    propertyId = 0x1a4;
    cVar1 = pTVar4->m_ES2018RegExDotAll;
    goto joined_r0x00bb3a4f;
  case 0x1a6:
    pTVar4 = (pSVar2->config).threadConfig;
    PVar5 = 0x1a6;
    propertyId = 0x1a6;
    cVar1 = pTVar4->m_ES6Unicode;
joined_r0x00bb3a4f:
    if (cVar1 != '\x01') goto switchD_00bb39ea_caseD_1a1;
    break;
  case 0x1a7:
    pTVar4 = (pSVar2->config).threadConfig;
    propertyId = 0x1a7;
    if ((pTVar4->m_ES6RegExSticky == true) && (pTVar4->m_ES6RegExPrototypeProperties != true)) {
      return 0;
    }
    goto switchD_00bb39ea_caseD_1a1;
  default:
    if ((propertyId != 0x1e0) && (propertyId != 0x153)) goto switchD_00bb39ea_caseD_1a1;
  case 0x1a0:
  case 0x1a3:
  case 0x1a5:
    pTVar4 = (pSVar2->config).threadConfig;
    PVar5 = propertyId;
  }
  propertyId = PVar5;
  if (pTVar4->m_ES6RegExPrototypeProperties == false) {
switchD_00bb39ea_caseD_1a2:
    return 0;
  }
switchD_00bb39ea_caseD_1a1:
  BVar3 = DynamicObject::IsConfigurable(&this->super_DynamicObject,propertyId);
  return BVar3;
}

Assistant:

BOOL JavascriptRegExp::IsConfigurable(PropertyId propertyId)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define IS_CONFIGURABLE(ownProperty) \
        return (ownProperty ? false : DynamicObject::IsConfigurable(propertyId));

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            return false;
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            IS_CONFIGURABLE(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            IS_CONFIGURABLE(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            IS_CONFIGURABLE(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            IS_CONFIGURABLE(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return DynamicObject::IsConfigurable(propertyId);
        }

#undef IS_CONFIGURABLE
    }